

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CheckerMemberVisitor::handle(CheckerMemberVisitor *this,ProceduralBlockSymbol *symbol)

{
  ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false> *in_RSI;
  long in_RDI;
  Scope *in_stack_00000080;
  SourceLocation in_stack_00000088;
  DiagCode in_stack_00000094;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  if ((*(int *)(in_RSI + 0x40) != 1) && (((byte)in_RSI[0x44] & 1) == 0)) {
    if (*(int *)(in_RSI + 0x40) == 2) {
      Scope::addDiag(in_stack_00000080,in_stack_00000094,in_stack_00000088);
    }
    else {
      *(ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false> **)(in_RDI + 8) =
           in_RSI;
      ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false>::
      visitDefault<slang::ast::ProceduralBlockSymbol>
                (in_RSI,(ProceduralBlockSymbol *)
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      *(undefined8 *)(in_RDI + 8) = 0;
    }
  }
  return;
}

Assistant:

void handle(const ProceduralBlockSymbol& symbol) {
        // Everything is allowed in final blocks, and implicit procedures created
        // for assertions should be ignored.
        if (symbol.procedureKind == ProceduralBlockKind::Final || symbol.isFromAssertion)
            return;

        if (symbol.procedureKind == ProceduralBlockKind::Always) {
            body.addDiag(diag::AlwaysInChecker, symbol.location);
            return;
        }

        SLANG_ASSERT(!currBlock);
        currBlock = &symbol;
        visitDefault(symbol);
        currBlock = nullptr;
    }